

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationPoints.h
# Opt level: O2

IntegrationPointList<1> *
anurbs::IntegrationPoints::get
          (IntegrationPointList<1> *__return_storage_ptr__,size_t degree,Interval *domain)

{
  double dVar1;
  pointer ptVar2;
  IntegrationPointList<1> *pIVar3;
  tuple<double,_double> *norm_point;
  pointer ptVar4;
  _Head_base<0UL,_double,_false> *p_Var5;
  double dVar6;
  allocator_type local_19;
  
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::vector
            (__return_storage_ptr__,degree,&local_19);
  pIVar3 = gauss_legendre(degree);
  ptVar2 = (pIVar3->
           super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  p_Var5 = &(((__return_storage_ptr__->
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->super__Tuple_impl<0UL,_double,_double>).
            super__Head_base<0UL,_double,_false>;
  for (ptVar4 = (pIVar3->
                super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar2; ptVar4 = ptVar4 + 1) {
    dVar6 = domain->m_t1 - domain->m_t0;
    dVar1 = (ptVar4->super__Tuple_impl<0UL,_double,_double>).super__Tuple_impl<1UL,_double>.
            super__Head_base<1UL,_double,_false>._M_head_impl;
    p_Var5->_M_head_impl =
         (ptVar4->super__Tuple_impl<0UL,_double,_double>).super__Head_base<0UL,_double,_false>.
         _M_head_impl * dVar6 + domain->m_t0;
    (((_Tuple_impl<0UL,_double,_double> *)(p_Var5 + -1))->super__Tuple_impl<1UL,_double>).
    super__Head_base<1UL,_double,_false>._M_head_impl = ABS(dVar6) * dVar1;
    p_Var5 = p_Var5 + 2;
  }
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<1> get(const size_t degree,
        const Interval& domain)
    {
        IntegrationPointList<1> integration_points(degree);

        Index i = 0;

        for (const auto& norm_point : gauss_legendre(degree)) {
            integration_points[i++] = IntegrationPoint<1>(
                domain.parameter_at_normalized(std::get<0>(norm_point)),
                std::get<1>(norm_point) * domain.length());
        }

        return integration_points;
    }